

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation_Balanced
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index,bool update)

{
  size_t sVar1;
  VmaDeviceMemoryBlock *pBlock;
  VmaBlockMetadata *pVVar2;
  size_t sVar3;
  VmaBlockMetadata *pVVar4;
  VmaDefragmentationMove *pVVar5;
  VkDeviceSize alignment;
  VmaSuballocationType suballocType;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  VkResult VVar12;
  ulong uVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar15;
  ulong uVar16;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined7 in_register_00000009;
  size_t end;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  VmaAllocationCreateFlags VVar20;
  StateBalanced *state;
  MoveAllocationData moveData;
  VmaAllocationRequest local_68;
  long lVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  state = (StateBalanced *)(index * 0x10 + (long)this->m_AlgorithmState);
  if (((int)CONCAT71(in_register_00000009,update) != 0) &&
     (state->avgAllocSize == 0xffffffffffffffff)) {
    UpdateVectorStatistics(this,vector,state);
  }
  sVar1 = (this->m_Moves).m_Count;
  end = (vector->m_Blocks).m_Count - 1;
  bVar8 = this->m_ImmovableBlockCount < end;
  if (this->m_ImmovableBlockCount < end) {
    uVar13 = state->avgFreeSize >> 1;
    do {
      pBlock = (vector->m_Blocks).m_pArray[end];
      pVVar2 = pBlock->m_pMetadata;
      iVar9 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
      lVar14 = CONCAT44(extraout_var,iVar9);
      if (lVar14 != 0) {
        uVar19 = 0;
        do {
          moveData.move.operation = VMA_DEFRAGMENTATION_MOVE_OPERATION_COPY;
          moveData.move.srcAllocation = (VmaAllocation)0x0;
          moveData.move.dstTmpAllocation = (VmaAllocation)0x0;
          iVar9 = (*pVVar2->_vptr_VmaBlockMetadata[10])(pVVar2,lVar14);
          moveData.move.srcAllocation = (VmaAllocation)CONCAT44(extraout_var_00,iVar9);
          moveData.size = (moveData.move.srcAllocation)->m_Size;
          moveData.alignment = (moveData.move.srcAllocation)->m_Alignment;
          moveData.type = (VmaSuballocationType)(moveData.move.srcAllocation)->m_SuballocationType;
          VVar20 = ((moveData.move.srcAllocation)->m_Flags & 1) * 4;
          moveData.flags = VVar20 + 0xc00;
          if (((moveData.move.srcAllocation)->m_Flags & 2) == 0) {
            moveData.flags = VVar20;
          }
          iVar9 = 7;
          uVar15 = uVar19;
          if ((VmaDefragmentationContext_T *)(moveData.move.srcAllocation)->m_pUserData != this) {
            iVar10 = 0;
            if (this->m_MaxPassBytes < moveData.size + (this->m_PassStats).bytesMoved) {
              bVar6 = this->m_IgnoredAllocs + 1;
              this->m_IgnoredAllocs = bVar6;
              iVar10 = 2 - (uint)(bVar6 < 0x10);
            }
            if (iVar10 != 1) {
              if (iVar10 == 2) {
                iVar9 = 1;
              }
              else {
                sVar3 = (this->m_Moves).m_Count;
                bVar7 = AllocInOtherBlock(this,0,end,&moveData,vector);
                iVar9 = 1;
                if (!bVar7) {
                  iVar9 = (*pVVar2->_vptr_VmaBlockMetadata[0xd])(pVVar2,lVar14);
                  uVar15 = CONCAT44(extraout_var_02,iVar9);
                  if ((moveData.move.srcAllocation)->m_Type == '\x01') {
                    pVVar4 = (((moveData.move.srcAllocation)->field_0).m_BlockAllocation.m_Block)->
                             m_pMetadata;
                    iVar9 = (*pVVar4->_vptr_VmaBlockMetadata[9])
                                      (pVVar4,((moveData.move.srcAllocation)->field_0).
                                              m_BlockAllocation.m_AllocHandle);
                    uVar16 = CONCAT44(extraout_var_03,iVar9);
                  }
                  else {
                    uVar16 = 0;
                  }
                  iVar9 = 0;
                  iVar10 = 0;
                  if ((((uVar16 != 0) && (sVar3 == (this->m_Moves).m_Count)) &&
                      (iVar11 = (*pVVar2->_vptr_VmaBlockMetadata[6])(pVVar2),
                      suballocType = moveData.type, alignment = moveData.alignment,
                      moveData.size <= CONCAT44(extraout_var_04,iVar11))) &&
                     (((iVar9 = iVar10, uVar13 <= uVar19 || (uVar13 <= uVar15)) ||
                      ((moveData.size <= state->avgFreeSize ||
                       (moveData.size <= state->avgAllocSize)))))) {
                    local_68.customData = (void *)0x0;
                    local_68.algorithmData = 0;
                    local_68.item.m_pList = (VmaRawList<VmaSuballocation> *)0x0;
                    local_68.item.m_pItem = (VmaListItem<VmaSuballocation> *)0x0;
                    local_68.allocHandle = (VmaAllocHandle)0x0;
                    local_68.size = 0;
                    local_68.type = Normal;
                    iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[0x11])(pVVar2);
                    if ((((char)iVar10 != '\0') &&
                        (iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[9])(pVVar2,local_68.allocHandle),
                        CONCAT44(extraout_var_05,iVar10) < uVar16)) &&
                       (VVar12 = VmaBlockVector::CommitAllocationRequest
                                           (vector,&local_68,pBlock,alignment,moveData.flags,this,
                                            suballocType,&moveData.move.dstTmpAllocation),
                       VVar12 == VK_SUCCESS)) {
                      sVar3 = (this->m_Moves).m_Count;
                      VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::
                      resize(&this->m_Moves,sVar3 + 1);
                      pVVar5 = (this->m_Moves).m_pArray;
                      pVVar5[sVar3].dstTmpAllocation = moveData.move.dstTmpAllocation;
                      pVVar5 = pVVar5 + sVar3;
                      *(ulong *)pVVar5 = CONCAT44(moveData.move._4_4_,moveData.move.operation);
                      pVVar5->srcAllocation = moveData.move.srcAllocation;
                      uVar16 = this->m_MaxPassBytes;
                      uVar17 = (this->m_PassStats).bytesMoved + moveData.size;
                      (this->m_PassStats).bytesMoved = uVar17;
                      uVar18 = (this->m_PassStats).allocationsMoved + 1;
                      (this->m_PassStats).allocationsMoved = uVar18;
                      if ((this->m_MaxPassAllocations <= uVar18) || (uVar16 <= uVar17)) {
                        iVar9 = 1;
                        uVar15 = uVar19;
                      }
                    }
                  }
                }
              }
            }
          }
          uVar19 = uVar15;
          if ((iVar9 != 7) && (iVar9 != 0)) goto LAB_001c0925;
          iVar9 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar14);
          lVar14 = CONCAT44(extraout_var_01,iVar9);
        } while (lVar14 != 0);
      }
      iVar9 = 5;
LAB_001c0925:
      if ((iVar9 != 5) && (iVar9 != 0)) {
        if (bVar8) {
          return true;
        }
        break;
      }
      end = end - 1;
      bVar8 = this->m_ImmovableBlockCount < end;
    } while (this->m_ImmovableBlockCount < end);
  }
  if (sVar1 == (this->m_Moves).m_Count && !update) {
    state->avgAllocSize = 0xffffffffffffffff;
    bVar8 = ComputeDefragmentation_Balanced(this,vector,index,false);
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation_Balanced(VmaBlockVector& vector, size_t index, bool update)
{
    // Go over every allocation and try to fit it in previous blocks at lowest offsets,
    // if not possible: realloc within single block to minimize offset (exclude offset == 0),
    // but only if there are noticable gaps between them (some heuristic, ex. average size of allocation in block)
    VMA_ASSERT(m_AlgorithmState != VMA_NULL);

    StateBalanced& vectorState = reinterpret_cast<StateBalanced*>(m_AlgorithmState)[index];
    if (update && vectorState.avgAllocSize == UINT64_MAX)
        UpdateVectorStatistics(vector, vectorState);

    const size_t startMoveCount = m_Moves.size();
    VkDeviceSize minimalFreeRegion = vectorState.avgFreeSize / 2;
    for (size_t i = vector.GetBlockCount() - 1; i > m_ImmovableBlockCount; --i)
    {
        VmaDeviceMemoryBlock* block = vector.GetBlock(i);
        VmaBlockMetadata* metadata = block->m_pMetadata;
        VkDeviceSize prevFreeRegionSize = 0;

        for (VmaAllocHandle handle = metadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = metadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, metadata);
            // Ignore newly created allocations by defragmentation algorithm
            if (moveData.move.srcAllocation->GetUserData() == this)
                continue;
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Check all previous blocks for free space
            const size_t prevMoveCount = m_Moves.size();
            if (AllocInOtherBlock(0, i, moveData, vector))
                return true;

            VkDeviceSize nextFreeRegionSize = metadata->GetNextFreeRegionSize(handle);
            // If no room found then realloc within block for lower offset
            VkDeviceSize offset = moveData.move.srcAllocation->GetOffset();
            if (prevMoveCount == m_Moves.size() && offset != 0 && metadata->GetSumFreeSize() >= moveData.size)
            {
                // Check if realloc will make sense
                if (prevFreeRegionSize >= minimalFreeRegion ||
                    nextFreeRegionSize >= minimalFreeRegion ||
                    moveData.size <= vectorState.avgFreeSize ||
                    moveData.size <= vectorState.avgAllocSize)
                {
                    VmaAllocationRequest request = {};
                    if (metadata->CreateAllocationRequest(
                        moveData.size,
                        moveData.alignment,
                        false,
                        moveData.type,
                        VMA_ALLOCATION_CREATE_STRATEGY_MIN_OFFSET_BIT,
                        &request))
                    {
                        if (metadata->GetAllocationOffset(request.allocHandle) < offset)
                        {
                            if (vector.CommitAllocationRequest(
                                request,
                                block,
                                moveData.alignment,
                                moveData.flags,
                                this,
                                moveData.type,
                                &moveData.move.dstTmpAllocation) == VK_SUCCESS)
                            {
                                m_Moves.push_back(moveData.move);
                                if (IncrementCounters(moveData.size))
                                    return true;
                            }
                        }
                    }
                }
            }
            prevFreeRegionSize = nextFreeRegionSize;
        }
    }
    
    // No moves perfomed, update statistics to current vector state
    if (startMoveCount == m_Moves.size() && !update)
    {
        vectorState.avgAllocSize = UINT64_MAX;
        return ComputeDefragmentation_Balanced(vector, index, false);
    }
    return false;
}